

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError GetAlsaStreamPointer(PaStream *s,PaAlsaStream **stream)

{
  bool bVar1;
  PaAlsaHostApiRepresentation *alsaHostApi;
  PaUtilHostApiRepresentation *hostApi;
  PaAlsaStream **ppPStack_18;
  PaError result;
  PaAlsaStream **stream_local;
  PaStream *s_local;
  
  hostApi._4_4_ = 0;
  ppPStack_18 = stream;
  stream_local = (PaAlsaStream **)s;
  paUtilErr_ = PaUtil_ValidateStreamPointer(s);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaUtil_ValidateStreamPointer( s )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4708\n"
                     );
  }
  else {
    paUtilErr_ = PaUtil_GetHostApiRepresentation
                           ((PaUtilHostApiRepresentation **)&alsaHostApi,paALSA);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaUtil_GetHostApiRepresentation( &hostApi, paALSA )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4709\n"
                       );
    }
    else {
      bVar1 = true;
      if (stream_local[2] != (PaAlsaStream *)&alsaHostApi->callbackStreamInterface) {
        bVar1 = stream_local[2] == (PaAlsaStream *)&alsaHostApi->blockingStreamInterface;
      }
      if (bVar1) {
        *ppPStack_18 = (PaAlsaStream *)stream_local;
      }
      else {
        PaUtil_DebugPrint(
                         "Expression \'PA_STREAM_REP( s )->streamInterface == &alsaHostApi->callbackStreamInterface || PA_STREAM_REP( s )->streamInterface == &alsaHostApi->blockingStreamInterface\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4714\n"
                         );
      }
    }
  }
  return 0;
}

Assistant:

static PaError GetAlsaStreamPointer( PaStream* s, PaAlsaStream** stream )
{
    PaError result = paNoError;
    PaUtilHostApiRepresentation* hostApi;
    PaAlsaHostApiRepresentation* alsaHostApi;

    PA_ENSURE( PaUtil_ValidateStreamPointer( s ) );
    PA_ENSURE( PaUtil_GetHostApiRepresentation( &hostApi, paALSA ) );
    alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;

    PA_UNLESS( PA_STREAM_REP( s )->streamInterface == &alsaHostApi->callbackStreamInterface
            || PA_STREAM_REP( s )->streamInterface == &alsaHostApi->blockingStreamInterface,
        paIncompatibleStreamHostApi );

    *stream = (PaAlsaStream*)s;
error:
    return paNoError;
}